

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

_Bool ego_action(menu *menu,ui_event *event,wchar_t oid)

{
  ui_event_type uVar1;
  ego_desc *choice;
  wchar_t oid_local;
  ui_event *event_local;
  menu *menu_local;
  
  uVar1 = event->type;
  if (uVar1 == EVT_SELECT) {
    ego_ignore_toggle((int)*(short *)((long)menu->menu_data + (long)oid * 0x10),
                      (uint)*(ushort *)((long)menu->menu_data + (long)oid * 0x10 + 2));
  }
  return uVar1 == EVT_SELECT;
}

Assistant:

static bool ego_action(struct menu * menu, const ui_event * event, int oid)
{
	struct ego_desc *choice = menu->menu_data;

	/* Toggle */
	if (event->type == EVT_SELECT) {
		ego_ignore_toggle(choice[oid].e_idx, choice[oid].itype);

		return true;
	}

	return false;
}